

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O0

void __thiscall
Assimp::StreamReader<true,_true>::StreamReader
          (StreamReader<true,_true> *this,shared_ptr<Assimp::IOStream> *stream,bool le)

{
  bool bVar1;
  bool le_local;
  shared_ptr<Assimp::IOStream> *stream_local;
  StreamReader<true,_true> *this_local;
  
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&this->stream,stream);
  this->le = le;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)stream);
  if (!bVar1) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StreamReader.h"
                  ,0x62,
                  "Assimp::StreamReader<true, true>::StreamReader(std::shared_ptr<IOStream>, bool) [SwapEndianess = true, RuntimeSwitch = true]"
                 );
  }
  InternBegin(this);
  return;
}

Assistant:

StreamReader(std::shared_ptr<IOStream> stream, bool le = false)
        : stream(stream)
        , le(le)
    {
        ai_assert(stream);
        InternBegin();
    }